

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::scrollTo(QTreeView *this,QModelIndex *index,ScrollHint hint)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  State SVar6;
  int iVar7;
  ScrollMode SVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Representation RVar12;
  QScrollBar *pQVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QRect local_80;
  undefined1 local_70 [12];
  Representation RStack_64;
  QAbstractItemModel *local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar4 = QAbstractItemViewPrivate::isIndexValid(&this_00->super_QAbstractItemViewPrivate,index);
  if (!bVar4) goto LAB_00540f7c;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  QTreeViewPrivate::updateScrollBars(this_00);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent((QModelIndex *)&local_58,index);
  while (((((bVar4 = ::operator!=((QModelIndex *)&local_58,
                                  &(this_00->super_QAbstractItemViewPrivate).root), bVar4 &&
            (-1 < (int)local_58)) && (-1 < (long)local_58)) &&
          ((local_48.ptr != (QAbstractItemModel *)0x0 &&
           (SVar6 = QAbstractItemView::state((QAbstractItemView *)this), SVar6 == NoState)))) &&
         (this_00->itemsExpandable == true))) {
    bVar4 = isExpanded(this,(QModelIndex *)&local_58);
    if (!bVar4) {
      expand(this,(QModelIndex *)&local_58);
    }
    pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0x68))(local_70,pQVar1,(QModelIndex *)&local_58);
    local_48.ptr = local_60;
    local_58 = (undefined1 *)local_70._0_8_;
    puStack_50 = stack0xffffffffffffff98;
  }
  iVar7 = QTreeViewPrivate::viewIndex(this_00,index);
  if (iVar7 < 0) goto LAB_00540f7c;
  QVar14 = QWidget::rect((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         viewport);
  _local_70 = QVar14;
  SVar8 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar8 == ScrollPerItem) {
    pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar9 = QAbstractSlider::value(&pQVar13->super_QAbstractSlider);
    pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar10 = QAbstractSlider::pageStep(&pQVar13->super_QAbstractSlider);
    if (((hint != EnsureVisible) || (iVar7 < iVar9)) || (iVar10 + iVar9 <= iVar7)) {
      if ((hint != PositionAtTop) && (hint != EnsureVisible || iVar9 <= iVar7)) {
        iVar9 = QTreeViewPrivate::itemHeight(this_00,iVar7);
        iVar10 = (QVar14.y2.m_i.m_i - QVar14.y1.m_i) + 1;
        if (hint == PositionAtCenter) {
          iVar10 = iVar9 + iVar10 / 2 + -1;
        }
        if (iVar9 < iVar10) {
          do {
            iVar9 = QTreeViewPrivate::itemHeight(this_00,iVar7);
            iVar10 = iVar10 - iVar9;
            if (iVar10 < 0) {
              iVar7 = iVar7 + 1;
              goto LAB_00540ec2;
            }
            bVar4 = 0 < iVar7;
            iVar7 = iVar7 + -1;
          } while (bVar4);
          iVar7 = -1;
        }
      }
LAB_00540ec2:
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      goto LAB_00540ed0;
    }
  }
  else {
    iVar9 = columnViewportPosition(this,index->c);
    iVar10 = QTreeViewPrivate::coordinateForItem(this_00,iVar7);
    iVar11 = columnWidth(this,index->c);
    iVar7 = QTreeViewPrivate::itemHeight(this_00,iVar7);
    local_80.x2.m_i = iVar11 + iVar9 + -1;
    local_80.y2.m_i = iVar7 + iVar10 + -1;
    local_80.x1.m_i = iVar9;
    local_80.y1.m_i = iVar10;
    if ((iVar9 <= local_80.x2.m_i) && (iVar10 <= local_80.y2.m_i)) {
      if (hint == EnsureVisible) {
        cVar5 = QRect::contains((QRect *)local_70,SUB81(&local_80,0));
        if (cVar5 != '\0') {
          QWidget::update((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                          .viewport,&local_80);
          goto LAB_00540ed5;
        }
        bVar4 = true;
        if ((int)local_70._4_4_ <= local_80.y1.m_i) {
          bVar4 = (RStack_64.m_i - local_70._4_4_) + 1 < (local_80.y2.m_i - local_80.y1.m_i) + 1;
        }
        if (local_80.y2.m_i <= RStack_64.m_i) goto LAB_00540cf7;
        bVar3 = (local_80.y2.m_i - local_80.y1.m_i) + 1 < (RStack_64.m_i - local_70._4_4_) + 1;
      }
      else {
        bVar4 = false;
LAB_00540cf7:
        bVar3 = false;
      }
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar7 = QAbstractSlider::value(&pQVar13->super_QAbstractSlider);
      RVar12.m_i = local_80.y1.m_i;
      if ((hint == PositionAtTop) || (bVar4)) {
LAB_00540e1a:
        iVar7 = iVar7 + RVar12.m_i;
      }
      else if ((bool)(hint != PositionAtBottom & (bVar3 ^ 1U))) {
        if (hint == PositionAtCenter) {
          iVar7 = iVar7 + local_80.y1.m_i;
          RVar12.m_i = (((RStack_64.m_i + local_80.y1.m_i) - local_70._4_4_) - local_80.y2.m_i) / -2
          ;
          goto LAB_00540e1a;
        }
      }
      else {
        iVar7 = local_80.y2.m_i + iVar7 + ~RStack_64.m_i + local_70._4_4_;
      }
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
LAB_00540ed0:
      QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar7);
    }
  }
LAB_00540ed5:
  pQVar2 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  iVar11 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
  iVar7 = QHeaderView::offset(this_00->header);
  iVar9 = QHeaderView::sectionPosition(this_00->header,index->c);
  iVar10 = QHeaderView::sectionSize(this_00->header,index->c);
  if (hint == PositionAtCenter) {
    pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar9 = iVar9 + (iVar11 - iVar10) / -2;
  }
  else if ((iVar9 - iVar7 < 0) || (iVar11 < iVar10)) {
    pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  }
  else {
    if ((iVar9 - iVar7) + iVar10 <= iVar11) goto LAB_00540f7c;
    pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    iVar9 = (iVar9 - iVar11) + iVar10;
  }
  QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar9);
LAB_00540f7c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTreeView);

    if (!d->isIndexValid(index))
        return;

    d->executePostedLayout();
    d->updateScrollBars();

    // Expand all parents if the parent(s) of the node are not expanded.
    QModelIndex parent = index.parent();
    while (parent != d->root && parent.isValid() && state() == NoState && d->itemsExpandable) {
        if (!isExpanded(parent))
            expand(parent);
        parent = d->model->parent(parent);
    }

    int item = d->viewIndex(index);
    if (item < 0)
        return;

    QRect area = d->viewport->rect();

    // vertical
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        int top = verticalScrollBar()->value();
        int bottom = top + verticalScrollBar()->pageStep();
        if (hint == EnsureVisible && item >= top && item < bottom) {
            // nothing to do
        } else if (hint == PositionAtTop || (hint == EnsureVisible && item < top)) {
            verticalScrollBar()->setValue(item);
        } else { // PositionAtBottom or PositionAtCenter
            const int currentItemHeight = d->itemHeight(item);
            int y = (hint == PositionAtCenter
                 //we center on the current item with a preference to the top item (ie. -1)
                     ? area.height() / 2 + currentItemHeight - 1
                 //otherwise we simply take the whole space
                     : area.height());
            if (y > currentItemHeight) {
                while (item >= 0) {
                    y -= d->itemHeight(item);
                    if (y < 0) { //there is no more space left
                        item++;
                        break;
                    }
                    item--;
                }
            }
            verticalScrollBar()->setValue(item);
        }
    } else { // ScrollPerPixel
        QRect rect(columnViewportPosition(index.column()),
                   d->coordinateForItem(item), // ### slow for items outside the view
                   columnWidth(index.column()),
                   d->itemHeight(item));

        if (rect.isEmpty()) {
            // nothing to do
        } else if (hint == EnsureVisible && area.contains(rect)) {
            d->viewport->update(rect);
            // nothing to do
        } else {
            bool above = (hint == EnsureVisible
                        && (rect.top() < area.top()
                            || area.height() < rect.height()));
            bool below = (hint == EnsureVisible
                        && rect.bottom() > area.bottom()
                        && rect.height() < area.height());

            int verticalValue = verticalScrollBar()->value();
            if (hint == PositionAtTop || above)
                verticalValue += rect.top();
            else if (hint == PositionAtBottom || below)
                verticalValue += rect.bottom() - area.height();
            else if (hint == PositionAtCenter)
                verticalValue += rect.top() - ((area.height() - rect.height()) / 2);
            verticalScrollBar()->setValue(verticalValue);
        }
    }
    // horizontal
    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->header->offset();
    int horizontalPosition = d->header->sectionPosition(index.column());
    int cellWidth = d->header->sectionSize(index.column());

    if (hint == PositionAtCenter) {
        horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
    } else {
        if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
            horizontalScrollBar()->setValue(horizontalPosition);
        else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
            horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
    }
}